

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  int *piVar5;
  void *pvVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  Mat *pMVar9;
  undefined8 uVar10;
  int iVar11;
  undefined8 uVar12;
  undefined1 uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  undefined4 *puVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  int k;
  ulong uVar27;
  int iVar28;
  ulong __n;
  float *pfVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_1c8;
  allocator_type local_1b9;
  ulong local_1b8;
  ulong local_1b0;
  int local_1a4;
  ulong local_1a0;
  void *local_198;
  ulong local_190;
  Mat *local_188;
  ulong local_180;
  long local_178;
  int local_170;
  uint local_16c;
  undefined1 local_168 [16];
  Mat local_158;
  undefined1 local_108 [16];
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  Mat local_c8;
  Option local_78;
  
  iVar23 = bottom_blob->c;
  iVar21 = -100;
  if ((iVar23 % this->group == 0) && (this->num_output % this->group == 0)) {
    iVar28 = this->kernel_w;
    iVar18 = this->dilation_w;
    iVar14 = this->kernel_h;
    iVar17 = this->dilation_h;
    sVar4 = bottom_blob->elemsize;
    local_c8.data = bottom_blob->data;
    piVar5 = bottom_blob->refcount;
    local_c8.refcount._0_4_ = SUB84(piVar5,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    local_c8.elemsize._0_4_ = (undefined4)sVar4;
    local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
    local_c8.elempack = bottom_blob->elempack;
    local_c8.allocator = bottom_blob->allocator;
    local_c8.dims = bottom_blob->dims;
    local_c8.w = bottom_blob->w;
    local_c8.h = bottom_blob->h;
    local_c8.d = bottom_blob->d;
    local_c8.cstep = bottom_blob->cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_188 = top_blob;
    local_c8.c = iVar23;
    if (sVar4 != 1) {
      uVar20 = (long)iVar23 / (long)this->group;
      local_158.cstep = 0;
      local_158.data = (undefined4 *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,iVar23,4,(Allocator *)0x0);
      iVar21 = this->group;
      if (0 < (long)iVar21) {
        pvVar6 = (this->bottom_blob_int8_scales).data;
        lVar24 = 0;
        puVar19 = (undefined4 *)local_158.data;
        do {
          if (0 < (int)uVar20) {
            uVar1 = *(undefined4 *)((long)pvVar6 + lVar24 * 4);
            uVar22 = uVar20 & 0xffffffff;
            do {
              *puVar19 = uVar1;
              puVar19 = puVar19 + 1;
              uVar25 = (int)uVar22 - 1;
              uVar22 = (ulong)uVar25;
            } while (uVar25 != 0);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != iVar21);
      }
      local_78._0_8_ = *(undefined8 *)opt;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      local_78.use_bf16_storage = opt->use_bf16_storage;
      local_78.use_fp16_packed = opt->use_fp16_packed;
      local_78.use_fp16_storage = opt->use_fp16_storage;
      local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      local_78.use_int8_packed = opt->use_int8_packed;
      local_78.use_int8_storage = opt->use_int8_storage;
      local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
      local_78.use_packing_layout = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78.blob_allocator = opt->workspace_allocator;
      quantize_to_int8(bottom_blob,&local_c8,&local_158,&local_78);
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_158.data != (undefined4 *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    make_padding(this,&local_c8,&local_158,this->kernel_w,this->kernel_h,opt);
    iVar11 = local_158.w;
    iVar21 = -100;
    if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
      uVar20 = (long)(~((iVar28 + -1) * iVar18) + local_158.w) / (long)this->stride_w;
      uVar22 = (long)(~((iVar14 + -1) * iVar17) + local_158.h) / (long)this->stride_h;
      __n = (long)this->kernel_h * (long)this->kernel_w;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_78,__n,&local_1b9);
      uVar12 = local_78._0_8_;
      pMVar9 = local_188;
      if (0 < this->kernel_h) {
        iVar21 = this->dilation_h;
        iVar28 = this->dilation_w;
        iVar18 = this->kernel_w;
        iVar14 = 0;
        iVar17 = 0;
        iVar26 = 0;
        do {
          if (0 < this->kernel_w) {
            lVar24 = 0;
            do {
              *(int *)(local_78._0_8_ + (iVar14 + lVar24) * 4) = iVar17;
              iVar17 = iVar17 + this->dilation_w;
              lVar24 = lVar24 + 1;
            } while ((int)lVar24 < this->kernel_w);
            iVar14 = iVar14 + (int)lVar24;
          }
          iVar17 = iVar17 + (iVar11 * iVar21 - iVar28 * iVar18);
          iVar26 = iVar26 + 1;
        } while (iVar26 < this->kernel_h);
      }
      local_1a4 = this->int8_scale_term;
      local_1a0 = uVar22 & 0xffffffff;
      local_190 = uVar20 & 0xffffffff;
      Mat::create(local_188,(int)uVar20 + 1,(int)uVar22 + 1,this->num_output,
                  (ulong)(local_1a4 < 0x65) * 3 + 1,opt->blob_allocator);
      iVar21 = -100;
      if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
        iVar21 = this->group;
        iVar28 = (int)__n;
        if (iVar21 == this->num_output && iVar23 == iVar21) {
          if (0 < this->group) {
            local_1b8 = (ulong)iVar28;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_168._8_8_;
            local_168 = auVar8 << 0x40;
            lVar24 = 0;
            uVar20 = local_1a0;
            do {
              if (-1 < (int)uVar20) {
                local_198 = (void *)(local_158.cstep * lVar24 *
                                     CONCAT44(local_158.elemsize._4_4_,
                                              (undefined4)local_158.elemsize) + (long)local_158.data
                                    );
                pfVar29 = (float *)(local_188->cstep * lVar24 * local_188->elemsize +
                                   (long)local_188->data);
                local_178 = (long)local_158.w *
                            CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
                pvVar6 = (this->weight_data).data;
                uVar10 = local_168._0_8_;
                local_1b0 = 0;
                do {
                  if (-1 < (int)local_190) {
                    lVar15 = (long)(int)local_1b0;
                    iVar23 = 0;
                    do {
                      fVar33 = 0.0;
                      fVar31 = 0.0;
                      if (0 < iVar28) {
                        uVar20 = 0;
                        iVar21 = 0;
                        do {
                          iVar21 = iVar21 + (int)*(char *)((long)pvVar6 + uVar20 + uVar10) *
                                            (int)*(char *)((long)local_198 +
                                                          (long)*(int *)(uVar12 + uVar20 * 4) +
                                                          this->stride_h * lVar15 * local_178 +
                                                          (long)iVar23 * (long)this->stride_w);
                          uVar20 = uVar20 + 1;
                        } while ((__n & 0xffffffff) != uVar20);
                        fVar31 = (float)iVar21;
                      }
                      fVar2 = *(float *)((long)(this->weight_data_int8_scales).data + lVar24 * 4);
                      if (fVar2 != 0.0) {
                        fVar33 = 1.0 / (fVar2 * *(float *)((long)(this->bottom_blob_int8_scales).
                                                                 data + lVar24 * 4));
                      }
                      fVar33 = fVar33 * fVar31;
                      if (this->bias_term != 0) {
                        fVar33 = fVar33 + *(float *)((long)(this->bias_data).data + lVar24 * 4);
                      }
                      fVar31 = fVar33;
                      switch(this->activation_type) {
                      case 1:
                        if (fVar33 <= 0.0) {
                          fVar31 = 0.0;
                        }
                        break;
                      case 2:
                        fVar31 = (float)(~-(uint)(0.0 < fVar33) & *(this->activation_params).data |
                                        -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                        break;
                      case 3:
                        pfVar7 = (float *)(this->activation_params).data;
                        fVar31 = *pfVar7;
                        if (fVar33 <= fVar31) {
                          fVar33 = fVar31;
                        }
                        fVar2 = pfVar7[1];
                        fVar31 = fVar33;
                        if (fVar2 <= fVar33) {
                          fVar31 = fVar2;
                        }
                        break;
                      case 4:
                        fVar31 = expf(-fVar33);
                        fVar31 = 1.0 / (fVar31 + 1.0);
                        break;
                      case 5:
                        local_108 = ZEXT416((uint)fVar33);
                        fVar31 = expf(fVar33);
                        fVar31 = logf(fVar31 + 1.0);
                        fVar31 = tanhf(fVar31);
                        fVar31 = fVar31 * (float)local_108._0_4_;
                        break;
                      case 6:
                        pfVar7 = (float *)(this->activation_params).data;
                        fVar2 = *pfVar7;
                        fVar3 = pfVar7[1];
                        fVar32 = -fVar3 / fVar2;
                        fVar31 = 0.0;
                        if ((fVar32 <= fVar33) && (fVar31 = fVar33, fVar33 <= fVar32 + 1.0 / fVar2))
                        {
                          fVar31 = (fVar2 * fVar33 + fVar3) * fVar33;
                        }
                      }
                      if (local_1a4 < 0x65) {
                        *pfVar29 = fVar31;
                        lVar16 = 4;
                      }
                      else {
                        fVar31 = roundf(fVar31 * *(float *)((long)(this->top_blob_int8_scales).data
                                                           + lVar24 * 4));
                        iVar21 = (int)fVar31;
                        if (iVar21 < -0x7e) {
                          iVar21 = -0x7f;
                        }
                        uVar13 = (undefined1)iVar21;
                        if (0x7e < iVar21) {
                          uVar13 = 0x7f;
                        }
                        *(undefined1 *)pfVar29 = uVar13;
                        lVar16 = 1;
                      }
                      pfVar29 = (float *)((long)pfVar29 + lVar16);
                      bVar30 = iVar23 != (int)local_190;
                      iVar23 = iVar23 + 1;
                    } while (bVar30);
                  }
                  iVar23 = (int)local_1b0;
                  local_1b0 = (ulong)(iVar23 + 1);
                  uVar20 = local_1a0;
                } while (iVar23 != (int)local_1a0);
              }
              lVar24 = lVar24 + 1;
              local_168._0_8_ = local_168._0_8_ + local_1b8;
            } while (lVar24 < this->group);
          }
        }
        else {
          uVar20 = (long)this->num_output / (long)iVar21;
          uVar22 = uVar20 & 0xffffffff;
          if (0 < this->group) {
            iVar14 = (int)((long)iVar23 / (long)iVar21);
            iVar18 = iVar14 * iVar28;
            local_16c = (uint)uVar20;
            local_170 = local_16c * iVar18;
            local_e8 = (long)iVar18;
            local_f0 = (long)(int)local_16c;
            local_d0 = uVar20 & 0xffffffff;
            local_198 = (void *)CONCAT44(local_198._4_4_,iVar14);
            local_1c8 = 0;
            do {
              if (0 < (int)uVar22) {
                local_d8 = local_1c8 * local_f0;
                local_e0 = (long)(local_170 * (int)local_1c8);
                uVar25 = (int)local_198 * (int)local_1c8;
                local_180 = 0;
                do {
                  if (-1 < (int)local_1a0) {
                    local_108._0_8_ = local_180 + local_d8;
                    pfVar29 = (float *)(local_188->cstep * (local_180 + local_d8) *
                                        local_188->elemsize + (long)local_188->data);
                    local_1b0 = (long)(this->weight_data).data + local_180 * local_e8 + local_e0;
                    local_1b8 = 0;
                    do {
                      if (-1 < (int)local_190) {
                        local_178 = (long)(int)local_1b8;
                        iVar18 = 0;
                        do {
                          fVar33 = 0.0;
                          fVar31 = 0.0;
                          if (0 < (int)local_198) {
                            uVar22 = 0;
                            iVar14 = 0;
                            uVar20 = local_1b0;
                            do {
                              if (0 < iVar28) {
                                uVar27 = 0;
                                do {
                                  iVar14 = iVar14 + (int)*(char *)(uVar20 + uVar27) *
                                                    (int)*(char *)((long)local_158.data +
                                                                  (long)*(int *)(uVar12 + uVar27 * 4
                                                                                ) +
                                                                  (uVar22 + uVar25) *
                                                                  local_158.cstep *
                                                                  CONCAT44(local_158.elemsize._4_4_,
                                                                           (undefined4)
                                                                           local_158.elemsize) +
                                                                  (long)iVar18 *
                                                                  (long)this->stride_w +
                                                                  (long)local_158.w *
                                                                  CONCAT44(local_158.elemsize._4_4_,
                                                                           (undefined4)
                                                                           local_158.elemsize) *
                                                                  this->stride_h * local_178);
                                  uVar27 = uVar27 + 1;
                                } while ((__n & 0xffffffff) != uVar27);
                              }
                              uVar20 = uVar20 + __n;
                              uVar22 = uVar22 + 1;
                            } while (uVar22 != ((long)iVar23 / (long)iVar21 & 0xffffffffU));
                            fVar31 = (float)iVar14;
                          }
                          fVar2 = *(float *)((long)(this->weight_data_int8_scales).data +
                                            local_1c8 * 4);
                          if (fVar2 != 0.0) {
                            fVar33 = 1.0 / (fVar2 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + local_1c8 * 4));
                          }
                          fVar33 = fVar33 * fVar31;
                          if (this->bias_term != 0) {
                            fVar33 = fVar33 + *(float *)((long)(this->bias_data).data +
                                                        local_108._0_8_ * 4);
                          }
                          fVar31 = fVar33;
                          switch(this->activation_type) {
                          case 1:
                            if (fVar33 <= 0.0) {
                              fVar31 = 0.0;
                            }
                            break;
                          case 2:
                            fVar31 = (float)(~-(uint)(0.0 < fVar33) &
                                             *(this->activation_params).data |
                                            -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                            break;
                          case 3:
                            pfVar7 = (float *)(this->activation_params).data;
                            fVar31 = *pfVar7;
                            if (fVar33 <= fVar31) {
                              fVar33 = fVar31;
                            }
                            fVar2 = pfVar7[1];
                            fVar31 = fVar33;
                            if (fVar2 <= fVar33) {
                              fVar31 = fVar2;
                            }
                            break;
                          case 4:
                            fVar31 = expf(-fVar33);
                            fVar31 = 1.0 / (fVar31 + 1.0);
                            break;
                          case 5:
                            local_168 = ZEXT416((uint)fVar33);
                            fVar31 = expf(fVar33);
                            fVar31 = logf(fVar31 + 1.0);
                            fVar31 = tanhf(fVar31);
                            fVar31 = fVar31 * (float)local_168._0_4_;
                            break;
                          case 6:
                            pfVar7 = (float *)(this->activation_params).data;
                            fVar2 = *pfVar7;
                            fVar3 = pfVar7[1];
                            fVar32 = -fVar3 / fVar2;
                            fVar31 = 0.0;
                            if ((fVar32 <= fVar33) &&
                               (fVar31 = fVar33, fVar33 <= fVar32 + 1.0 / fVar2)) {
                              fVar31 = (fVar2 * fVar33 + fVar3) * fVar33;
                            }
                          }
                          if (local_1a4 < 0x65) {
                            *pfVar29 = fVar31;
                            lVar24 = 4;
                          }
                          else {
                            fVar31 = roundf(fVar31 * *(float *)((long)(this->top_blob_int8_scales).
                                                                      data + local_1c8 * 4));
                            iVar14 = (int)fVar31;
                            if (iVar14 < -0x7e) {
                              iVar14 = -0x7f;
                            }
                            uVar13 = (undefined1)iVar14;
                            if (0x7e < iVar14) {
                              uVar13 = 0x7f;
                            }
                            *(undefined1 *)pfVar29 = uVar13;
                            lVar24 = 1;
                          }
                          pfVar29 = (float *)((long)pfVar29 + lVar24);
                          bVar30 = iVar18 != (int)local_190;
                          iVar18 = iVar18 + 1;
                        } while (bVar30);
                      }
                      iVar18 = (int)local_1b8;
                      local_1b8 = (ulong)(iVar18 + 1);
                    } while (iVar18 != (int)local_1a0);
                  }
                  local_180 = local_180 + 1;
                } while (local_180 != local_d0);
              }
              local_1c8 = local_1c8 + 1;
              uVar22 = (ulong)local_16c;
            } while (local_1c8 < this->group);
          }
        }
        iVar21 = 0;
      }
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_78.workspace_allocator - local_78._0_8_);
      }
    }
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar21;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}